

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O3

saidx64_t sort_typeBstar(sauchar_t *T,saidx64_t *SA,saidx64_t *bucket_A,saidx64_t *bucket_B,
                        saidx64_t n)

{
  saidx64_t sVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  long *plVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  uint uVar13;
  saidx64_t *psVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long *plVar22;
  int iVar23;
  bool bVar24;
  
  memset(bucket_A,0,0x800);
  memset(bucket_B,0,0x80000);
  uVar21 = n - 1;
  sVar1 = n;
  if (0 < n) {
    uVar2 = (ulong)T[uVar21];
    uVar7 = uVar21;
    while( true ) {
      uVar15 = uVar7;
      bucket_A[uVar2] = bucket_A[uVar2] + 1;
      if (uVar15 == 0) break;
      bVar4 = T[uVar15 - 1];
      uVar10 = (uint)uVar2;
      uVar2 = (ulong)bVar4;
      uVar7 = uVar15 - 1;
      if (bVar4 < uVar10) {
        bucket_B[(uint)bVar4 << 8 | uVar10] = bucket_B[(uint)bVar4 << 8 | uVar10] + 1;
        SA[sVar1 + -1] = uVar15 - 1;
        sVar1 = sVar1 + -1;
        if ((long)uVar15 < 2) break;
        uVar7 = uVar15 - 2;
        uVar15 = (ulong)bVar4;
        while( true ) {
          bVar4 = T[uVar7];
          uVar2 = (ulong)bVar4;
          if ((uint)uVar15 < (uint)bVar4) break;
          bucket_B[(uint)uVar15 << 8 | (uint)bVar4] = bucket_B[(uint)uVar15 << 8 | (uint)bVar4] + 1;
          bVar24 = (long)uVar7 < 1;
          uVar7 = uVar7 - 1;
          uVar15 = uVar2;
          if (bVar24) goto LAB_00101522;
        }
      }
    }
  }
LAB_00101522:
  plVar6 = bucket_B + 0x100;
  uVar7 = 0;
  lVar19 = 0;
  lVar16 = 0;
  psVar14 = bucket_B;
  do {
    lVar20 = bucket_A[uVar7];
    bucket_A[uVar7] = lVar19 + lVar16;
    lVar19 = lVar20 + lVar19 + bucket_B[(uint)((int)uVar7 << 8) | uVar7];
    if (uVar7 < 0xff) {
      lVar20 = 1;
      plVar22 = plVar6;
      do {
        lVar16 = lVar16 + psVar14[lVar20];
        psVar14[lVar20] = lVar16;
        lVar19 = lVar19 + *plVar22;
        plVar22 = plVar22 + 0x100;
        lVar9 = uVar7 + lVar20;
        lVar20 = lVar20 + 1;
      } while (lVar9 != 0xff);
    }
    uVar7 = uVar7 + 1;
    plVar6 = plVar6 + 0x101;
    psVar14 = psVar14 + 0x101;
  } while (uVar7 != 0x100);
  lVar16 = n - sVar1;
  if (lVar16 != 0 && sVar1 <= n) {
    if (lVar16 != 1) {
      lVar19 = lVar16 + -2;
      plVar6 = SA + n + -2;
      do {
        uVar11 = *(ushort *)(T + *plVar6) << 8 | *(ushort *)(T + *plVar6) >> 8;
        lVar20 = bucket_B[uVar11];
        bucket_B[uVar11] = lVar20 + -1;
        SA[lVar20 + -1] = lVar19;
        plVar6 = plVar6 + -1;
        bVar24 = lVar19 != 0;
        lVar19 = lVar19 + -1;
      } while (bVar24);
    }
    psVar14 = SA + lVar16;
    uVar7 = lVar16 - 1;
    uVar11 = *(ushort *)(T + SA[n + -1]) << 8 | *(ushort *)(T + SA[n + -1]) >> 8;
    lVar19 = bucket_B[uVar11];
    bucket_B[uVar11] = lVar19 + -1;
    SA[lVar19 + -1] = uVar7;
    iVar23 = 0xfe;
    lVar19 = lVar16;
    do {
      uVar10 = 0xff;
      lVar20 = lVar19;
      do {
        lVar19 = bucket_B[(int)(uVar10 | iVar23 << 8)];
        if (1 < lVar20 - lVar19) {
          sssort64(T,SA + (n - lVar16),SA + lVar19,SA + lVar20,psVar14,n + lVar16 * -2,2,n,
                   (uint)(SA[lVar19] == uVar7));
        }
        uVar10 = uVar10 - 1;
        lVar20 = lVar19;
      } while (iVar23 < (int)uVar10);
      iVar23 = iVar23 + -1;
      uVar2 = uVar7;
    } while (0 < lVar19);
    do {
      uVar15 = SA[uVar2];
      if (-1 < (long)uVar15) {
        lVar19 = 0;
        uVar8 = uVar2;
        do {
          uVar3 = uVar8;
          psVar14[uVar15] = uVar3;
          uVar8 = uVar3 - 1;
          if (uVar3 == 0) {
            *SA = ~uVar2;
            goto LAB_0010175d;
          }
          uVar15 = SA[uVar8];
          lVar19 = lVar19 + -1;
        } while (-1 < (long)uVar15);
        SA[uVar3] = lVar19;
        uVar2 = uVar8;
        if (uVar8 == 0) break;
      }
      uVar8 = uVar2 - 1;
      do {
        uVar3 = uVar8;
        SA[uVar3 + 1] = ~uVar15;
        psVar14[~uVar15] = uVar2;
        uVar15 = SA[uVar3];
        uVar8 = uVar3 - 1;
      } while ((long)uVar15 < 0);
      psVar14[uVar15] = uVar2;
      uVar2 = uVar3 - 1;
    } while (1 < (long)(uVar3 + 1));
LAB_0010175d:
    trsort64(psVar14,SA,lVar16,1);
    if (0 < n) {
      bVar4 = T[uVar21];
      lVar19 = lVar16;
      do {
        lVar20 = uVar21 + 1;
        bVar5 = bVar4;
        do {
          lVar9 = lVar20;
          if (lVar9 == 1) goto LAB_0010180b;
          bVar4 = T[lVar9 + -2];
          lVar20 = lVar9 + -1;
          bVar24 = bVar5 <= bVar4;
          bVar5 = bVar4;
        } while (bVar24);
        uVar21 = lVar9 - 3;
        if (1 < lVar20) {
          do {
            bVar4 = T[uVar21];
            if (bVar5 < bVar4) goto LAB_001017d7;
            bVar24 = 0 < (long)uVar21;
            uVar21 = uVar21 - 1;
            bVar5 = bVar4;
          } while (bVar24);
          uVar21 = 0xffffffffffffffff;
        }
LAB_001017d7:
        lVar17 = -lVar20;
        if (1 < (long)(~uVar21 + lVar20)) {
          lVar17 = lVar9 + -2;
        }
        if (lVar20 == 1) {
          lVar17 = lVar9 + -2;
        }
        lVar20 = lVar19 + -1;
        lVar19 = lVar19 + -1;
        SA[psVar14[lVar20]] = lVar17;
      } while (-1 < (long)uVar21);
    }
LAB_0010180b:
    bucket_B[0xffff] = n;
    uVar21 = 0xfe;
    do {
      uVar10 = (uint)uVar21;
      uVar12 = uVar10 << 8;
      uVar15 = 0xff;
      lVar19 = bucket_A[uVar21 + 1] + -1;
      uVar2 = uVar7;
      do {
        uVar13 = (uint)uVar15;
        uVar18 = uVar13 << 8 | uVar10;
        lVar20 = lVar19 - bucket_B[(int)uVar18];
        bucket_B[(int)uVar18] = lVar19;
        lVar19 = bucket_B[(int)(uVar13 | uVar12)];
        uVar7 = uVar2;
        if (lVar19 <= (long)uVar2) {
          do {
            SA[lVar20] = SA[uVar2];
            lVar20 = lVar20 + -1;
            uVar7 = uVar2 - 1;
            bVar24 = lVar19 < (long)uVar2;
            uVar2 = uVar7;
          } while (bVar24);
        }
        uVar15 = (ulong)(uVar13 - 1);
        lVar19 = lVar20;
        uVar2 = uVar7;
      } while (uVar21 < uVar15);
      bucket_B[(int)(uVar10 + 1 | uVar12)] = (lVar20 - bucket_B[(int)(uVar12 | uVar10)]) + 1;
      bucket_B[(int)(uVar12 | uVar10)] = lVar20;
      bVar24 = uVar21 != 0;
      uVar21 = uVar21 - 1;
    } while (bVar24);
  }
  return lVar16;
}

Assistant:

static
saidx_t
sort_typeBstar(const sauchar_t *T, saidx_t *SA,
               saidx_t *bucket_A, saidx_t *bucket_B,
               saidx_t n) {
  saidx_t *PAb, *ISAb, *buf;
#ifdef _OPENMP
  saidx_t *curbuf;
  saidx_t l;
#endif
  saidx_t i, j, k, t, m, bufsize;
  saint_t c0, c1;
#ifdef _OPENMP
  saint_t d0, d1;
  int tmp;
#endif

  /* Initialize bucket arrays. */
  for(i = 0; i < BUCKET_A_SIZE; ++i) { bucket_A[i] = 0; }
  for(i = 0; i < BUCKET_B_SIZE; ++i) { bucket_B[i] = 0; }

  /* Count the number of occurrences of the first one or two characters of each
     type A, B and B* suffix. Moreover, store the beginning position of all
     type B* suffixes into the array SA. */
  for(i = n - 1, m = n, c0 = T[n - 1]; 0 <= i;) {
    /* type A suffix. */
    do { ++BUCKET_A(c1 = c0); } while((0 <= --i) && ((c0 = T[i]) >= c1));
    if(0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(c0, c1);
      SA[--m] = i;
      /* type B suffix. */
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) {
        ++BUCKET_B(c0, c1);
      }
    }
  }
  m = n - m;
/*
note:
  A type B* suffix is lexicographically smaller than a type B suffix that
  begins with the same first two characters.
*/

  /* Calculate the index of start/end point of each bucket. */
  for(c0 = 0, i = 0, j = 0; c0 < ALPHABET_SIZE; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0) = i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for(c1 = c0 + 1; c1 < ALPHABET_SIZE; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if(0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    PAb = SA + n - m; ISAb = SA + m;
    for(i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
#ifdef _OPENMP
    tmp = omp_get_max_threads();
    buf = SA + m, bufsize = (n - (2 * m)) / tmp;
    c0 = ALPHABET_SIZE - 2, c1 = ALPHABET_SIZE - 1, j = m;
#pragma omp parallel default(shared) private(curbuf, k, l, d0, d1, tmp)
    {
      tmp = omp_get_thread_num();
      curbuf = buf + tmp * bufsize;
      k = 0;
      for(;;) {
        #pragma omp critical(sssort_lock)
        {
          if(0 < (l = j)) {
            d0 = c0, d1 = c1;
            do {
              k = BUCKET_BSTAR(d0, d1);
              if(--d1 <= d0) {
                d1 = ALPHABET_SIZE - 1;
                if(--d0 < 0) { break; }
              }
            } while(((l - k) <= 1) && (0 < (l = k)));
            c0 = d0, c1 = d1, j = k;
          }
        }
        if(l == 0) { break; }
        sssort(T, PAb, SA + k, SA + l,
               curbuf, bufsize, 2, n, *(SA + k) == (m - 1));
      }
    }
#else
    buf = SA + m, bufsize = n - (2 * m);
    for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
        i = BUCKET_BSTAR(c0, c1);
        if(1 < (j - i)) {
          sssort(T, PAb, SA + i, SA + j,
                 buf, bufsize, 2, n, *(SA + i) == (m - 1));
        }
      }
    }
#endif

    /* Compute ranks of type B* substrings. */
    for(i = m - 1; 0 <= i; --i) {
      if(0 <= SA[i]) {
        j = i;
        do { ISAb[SA[i]] = i; } while((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if(i <= 0) { break; }
      }
      j = i;
      do { ISAb[SA[i] = ~SA[i]] = j; } while(SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using trsort. */
    trsort(ISAb, SA, m, 1);

    /* Set the sorted order of tyoe B* suffixes. */
    for(i = n - 1, j = m, c0 = T[n - 1]; 0 <= i;) {
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) >= c1); --i, c1 = c0) { }
      if(0 <= i) {
        t = i;
        for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) { }
        SA[ISAb[--j]] = ((t == 0) || (1 < (t - i))) ? t : ~t;
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    BUCKET_B(ALPHABET_SIZE - 1, ALPHABET_SIZE - 1) = n; /* end point */
    for(c0 = ALPHABET_SIZE - 2, k = m - 1; 0 <= c0; --c0) {
      i = BUCKET_A(c0 + 1) - 1;
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for(i = t, j = BUCKET_BSTAR(c0, c1);
            j <= k;
            --i, --k) { SA[i] = SA[k]; }
      }
      BUCKET_BSTAR(c0, c0 + 1) = i - BUCKET_B(c0, c0) + 1; /* start point */
      BUCKET_B(c0, c0) = i; /* end point */
    }
  }

  return m;
}